

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_value_numbering.cpp
# Opt level: O2

void __thiscall
mocker::GlobalValueNumbering::doValueNumbering
          (GlobalValueNumbering *this,size_t bbLabel,
          _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *valueNumber,
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *param_4)

{
  size_type *psVar1;
  GlobalValueNumbering *this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *ppVar2;
  _Hash_node_base _Var3;
  Key *pKVar4;
  undefined8 __ht;
  element_type *peVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  __type _Var8;
  __shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  element_type *peVar10;
  BasicBlock *pBVar11;
  LabelSet *pLVar12;
  __node_base *p_Var13;
  InstHash *this_02;
  GlobalValueNumbering *this_03;
  shared_ptr<mocker::ir::Label> *__y;
  shared_ptr<mocker::ir::Addr> *operand;
  pointer ppVar14;
  shared_ptr<mocker::ir::Reg> *psVar15;
  pointer ppVar16;
  shared_ptr<mocker::ir::Phi> phi_1;
  mapped_type res;
  shared_ptr<mocker::ir::Phi> phi;
  Key key;
  shared_ptr<mocker::ir::IntLiteral> lhsLit;
  shared_ptr<mocker::ir::Reg> rhsReg;
  __shared_ptr<mocker::ir::Deleted,_(__gnu_cxx::_Lock_policy)2> local_168;
  undefined1 local_150 [24];
  __shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2> local_138;
  Key local_128;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  local_108;
  GlobalValueNumbering *local_f0;
  element_type *local_e8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  element_type *local_c8;
  element_type *local_c0;
  undefined1 local_b8 [80];
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_150._16_8_ = param_4;
  local_f0 = this;
  local_b8._16_8_ = bbLabel;
  local_c8 = (element_type *)
             ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,bbLabel);
  local_c0 = (element_type *)&((BasicBlock *)local_c8)->insts;
  peVar10 = local_c0;
  while( true ) {
    do {
      peVar10 = (element_type *)(peVar10->super_Addr)._vptr_Addr;
      psVar1 = &(peVar10->identifier)._M_string_length;
      ir::dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&local_128,(shared_ptr<mocker::ir::IRInst> *)psVar1);
      _Var6._M_p = local_128._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
    } while (_Var6._M_p != (pointer)0x0);
    this_00 = (GlobalValueNumbering *)(local_150 + 0x18);
    this_03 = this_00;
    local_e8 = peVar10;
    ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
              ((ir *)this_00,(shared_ptr<mocker::ir::IRInst> *)psVar1);
    if (local_138._M_ptr == (element_type *)0x0) break;
    bVar7 = canProcessPhi(this_03,(shared_ptr<mocker::ir::Phi> *)this_00,
                          (ValueNumberTable *)valueNumber);
    if (bVar7) {
      peVar10 = *(element_type **)
                 &((local_138._M_ptr)->options).
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data;
      std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)&local_168,
                 (__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)peVar10);
      ppVar14 = ((local_138._M_ptr)->options).
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar16 = *(pointer *)
                 ((long)&((local_138._M_ptr)->options).
                         super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                         ._M_impl + 8);
      do {
        if (ppVar14 == ppVar16) {
          local_b8._0_8_ = local_168._M_ptr;
          local_b8._8_8_ = local_168._M_refcount._M_pi;
          local_168._M_ptr = (element_type *)0x0;
          local_168._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_0015ad41;
        }
        std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>
                  ((shared_ptr<mocker::ir::Addr> *)&local_128);
        std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
                  ((shared_ptr<mocker::ir::Addr> *)&local_108);
        if (local_108.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0 &&
            local_128._M_dataplus._M_p == (pointer)0x0) {
          __assert_fail("lhsReg || lhsLit",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/global_value_numbering.cpp"
                        ,0x86,
                        "bool mocker::(anonymous namespace)::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                       );
        }
        std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>
                  ((shared_ptr<mocker::ir::Addr> *)&local_e0);
        std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
                  ((shared_ptr<mocker::ir::Addr> *)local_150);
        if ((element_type *)local_e0._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0
            && (element_type *)local_150._0_8_ == (element_type *)0x0) {
          __assert_fail("rhsReg || rhsLit",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/global_value_numbering.cpp"
                        ,0x89,
                        "bool mocker::(anonymous namespace)::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                       );
        }
        peVar10 = (element_type *)local_e0._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)local_150._0_8_ == (element_type *)0x0 ||
            local_108.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          if (local_128._M_dataplus._M_p == (pointer)0x0 ||
              (element_type *)local_e0._M_impl.super__Vector_impl_data._M_start ==
              (element_type *)0x0) {
            _Var8 = false;
          }
          else {
            peVar10 = (element_type *)((long)local_e0._M_impl.super__Vector_impl_data._M_start + 8);
            _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(local_128._M_dataplus._M_p + 8),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)peVar10);
          }
        }
        else {
          _Var8 = ((local_108.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->first).
                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (((string *)(local_150._0_8_ + 8))->_M_dataplus)._M_p;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_e0._M_impl.super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_108.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
        ppVar14 = ppVar14 + 1;
      } while (_Var8 != false);
      local_b8._0_8_ = (element_type *)0x0;
      local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0015ad41:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
      if ((element_type *)local_b8._0_8_ != (element_type *)0x0) {
        detail::ValueNumberTable::set
                  ((ValueNumberTable *)valueNumber,&((local_138._M_ptr)->super_Definition).dest,
                   (shared_ptr<mocker::ir::Addr> *)local_b8);
        std::make_shared<mocker::ir::Deleted>();
        std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)psVar1,
                   (__shared_ptr<mocker::ir::Deleted,_(__gnu_cxx::_Lock_policy)2> *)&local_128);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
        local_f0->cnt = local_f0->cnt + 1;
        pKVar4 = (Key *)local_b8;
        goto LAB_0015ada5;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      detail::InstHash::operator()[abi_cxx11_
                (&local_128,(InstHash *)peVar10,(shared_ptr<mocker::ir::IRInst> *)psVar1);
      bVar7 = isIn<std::unordered_map<std::__cxx11::string,std::shared_ptr<mocker::ir::Reg>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>>,std::__cxx11::string>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                          *)local_150._16_8_,&local_128);
      peVar5 = local_138._M_ptr;
      if (bVar7) {
        p_Var9 = &std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)local_150._16_8_,&local_128)->
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::Reg,void>
                  ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_108,p_Var9);
        detail::ValueNumberTable::set
                  ((ValueNumberTable *)valueNumber,&(peVar5->super_Definition).dest,
                   (shared_ptr<mocker::ir::Addr> *)&local_108);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_108.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::make_shared<mocker::ir::Deleted>();
        std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)psVar1,
                   (__shared_ptr<mocker::ir::Deleted,_(__gnu_cxx::_Lock_policy)2> *)&local_108);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_108.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        local_f0->cnt = local_f0->cnt + 1;
      }
      else {
        psVar15 = &((local_138._M_ptr)->super_Definition).dest;
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::Reg,void>
                  ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_108,
                   &psVar15->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
        detail::ValueNumberTable::set
                  ((ValueNumberTable *)valueNumber,psVar15,
                   (shared_ptr<mocker::ir::Addr> *)&local_108);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_108.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        peVar5 = local_138._M_ptr;
        p_Var9 = &std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_150._16_8_,&local_128)->
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var9,&(peVar5->super_Definition).dest.
                           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      }
      std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      psVar15 = &((local_138._M_ptr)->super_Definition).dest;
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_128,
                 &psVar15->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      detail::ValueNumberTable::set
                ((ValueNumberTable *)valueNumber,psVar15,(shared_ptr<mocker::ir::Addr> *)&local_128)
      ;
      pKVar4 = &local_128;
LAB_0015ada5:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pKVar4->_M_string_length);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    peVar10 = local_e8;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  peVar10 = local_e8;
  do {
    if (peVar10 == local_c0) {
      ir::BasicBlock::getSuccessors
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e0,
                 (BasicBlock *)local_c8);
      local_c8 = (element_type *)local_e0._M_impl.super__Vector_impl_data._M_finish;
      do {
        if ((element_type *)local_e0._M_impl.super__Vector_impl_data._M_start == local_c8) {
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e0)
          ;
          pLVar12 = DominatorTree::getChildren(&local_f0->dominatorTree,local_b8._16_8_);
          __ht = local_150._16_8_;
          p_Var13 = &(pLVar12->_M_h)._M_before_begin;
          this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_b8 + 0x18);
          while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
            _Var3._M_nxt = p_Var13[1]._M_nxt;
            std::
            _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable(&local_68,valueNumber);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable(this_01,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                  *)__ht);
            doValueNumbering(local_f0,_Var3._M_nxt,&local_68,this_01);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(this_01);
            std::
            _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Addr>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_68);
          }
          return;
        }
        local_c0 = (element_type *)local_e0._M_impl.super__Vector_impl_data._M_start;
        pBVar11 = ir::FunctionModule::getMutableBasicBlock
                            ((local_f0->super_FuncPass).func,
                             (size_t)(((element_type *)
                                      local_e0._M_impl.super__Vector_impl_data._M_start)->super_Addr
                                     )._vptr_Addr);
        peVar10 = (element_type *)&pBVar11->insts;
        local_e8 = peVar10;
        while( true ) {
          peVar10 = (element_type *)(peVar10->super_Addr)._vptr_Addr;
          if (peVar10 == local_e8) break;
          psVar1 = &(peVar10->identifier)._M_string_length;
          ir::dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>&>
                    ((ir *)&local_128,(shared_ptr<mocker::ir::IRInst> *)psVar1);
          _Var6._M_p = local_128._M_dataplus._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
          if (_Var6._M_p == (pointer)0x0) {
            ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                      ((ir *)&local_168,(shared_ptr<mocker::ir::IRInst> *)psVar1);
            if (local_168._M_ptr == (element_type *)0x0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_168._M_refcount);
              break;
            }
            local_108.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_108.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.
            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ppVar2 = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *
                     )local_168._M_ptr[3].super_IRInst._vptr_IRInst;
            for (__y = (shared_ptr<mocker::ir::Label> *)
                       (*(long *)&local_168._M_ptr[2].super_IRInst.type + 0x10);
                (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
                (__y + -1) != ppVar2; __y = __y + 2) {
              if (((__y->super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->id == local_b8._16_8_) {
                detail::ValueNumberTable::get
                          ((ValueNumberTable *)local_150,(shared_ptr<mocker::ir::Addr> *)valueNumber
                          );
                std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>::
                pair<std::shared_ptr<mocker::ir::Addr>,_true>
                          ((pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                            *)&local_128,(shared_ptr<mocker::ir::Addr> *)local_150,__y);
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::
                emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>
                          ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                            *)&local_108,
                           (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                            *)&local_128);
                std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>::
                ~pair((pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                       *)&local_128);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
              }
              else {
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::
                emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>const&>
                          ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                            *)&local_108,
                           (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                            *)(__y + -1));
              }
            }
            std::
            make_shared<mocker::ir::Phi,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>>
                      ((shared_ptr<mocker::ir::Reg> *)(local_150 + 0x18),
                       (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                        *)&local_168._M_ptr[1].super_IRInst.type);
            std::
            vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
            ::~vector(&local_108);
            std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)psVar1,
                       (__shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_150 + 0x18));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount)
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount)
            ;
          }
        }
        local_e0._M_impl.super__Vector_impl_data._M_start = (pointer)&local_c0->identifier;
      } while( true );
    }
    psVar1 = &(peVar10->identifier)._M_string_length;
    local_e8 = peVar10;
    ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         *)&local_108,(shared_ptr<mocker::ir::IRInst> *)psVar1);
    ppVar14 = local_108.
              super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar16 = local_108.
                   super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar16 != ppVar14;
        ppVar16 = (pointer)&ppVar16->second) {
      detail::ValueNumberTable::get
                ((ValueNumberTable *)&local_128,(shared_ptr<mocker::ir::Addr> *)valueNumber);
      std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)ppVar16,
                 (__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
    }
    ir::copyWithReplacedOperands
              ((ir *)&local_128,(shared_ptr<mocker::ir::IRInst> *)psVar1,
               (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                *)&local_108);
    std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)psVar1,
               (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
    ir::getDest((shared_ptr<mocker::ir::IRInst> *)&local_e0);
    if ((element_type *)local_e0._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)&local_128,(shared_ptr<mocker::ir::IRInst> *)psVar1);
      if (local_128._M_dataplus._M_p == (pointer)0x0) {
        ir::dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)local_150,(shared_ptr<mocker::ir::IRInst> *)psVar1);
        if ((element_type *)local_150._0_8_ != (element_type *)0x0) {
LAB_0015afbd:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
          goto LAB_0015afc7;
        }
        ir::dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&local_168,(shared_ptr<mocker::ir::IRInst> *)psVar1);
        if (local_168._M_ptr != (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
          goto LAB_0015afbd;
        }
        ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)(local_150 + 0x18),(shared_ptr<mocker::ir::IRInst> *)psVar1);
        peVar5 = local_138._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
        if (peVar5 != (element_type *)0x0) goto LAB_0015afd1;
        this_02 = (InstHash *)psVar1;
        ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&local_128,(shared_ptr<mocker::ir::IRInst> *)psVar1);
        _Var6._M_p = local_128._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
        if (_Var6._M_p == (pointer)0x0) {
          detail::InstHash::operator()[abi_cxx11_
                    (&local_128,this_02,(shared_ptr<mocker::ir::IRInst> *)psVar1);
          bVar7 = isIn<std::unordered_map<std::__cxx11::string,std::shared_ptr<mocker::ir::Reg>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<mocker::ir::Reg>>>>,std::__cxx11::string>
                            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                              *)local_150._16_8_,&local_128);
          if (bVar7) {
            p_Var9 = &std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_150._16_8_,&local_128)->
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)local_150,p_Var9
                      );
            std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<mocker::ir::Reg,void>
                      ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_168,
                       (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)local_150);
            detail::ValueNumberTable::set
                      ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_e0,
                       (shared_ptr<mocker::ir::Addr> *)&local_168);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount)
            ;
            std::make_shared<mocker::ir::Deleted>();
            std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> *)psVar1,
                       &local_168);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount)
            ;
            local_f0->cnt = local_f0->cnt + 1;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
          }
          else {
            std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<mocker::ir::Reg,void>
                      ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)local_150,
                       (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&local_e0);
            detail::ValueNumberTable::set
                      ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_e0,
                       (shared_ptr<mocker::ir::Addr> *)local_150);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150 + 8));
            p_Var9 = &std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_150._16_8_,&local_128)->
                      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (p_Var9,(__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&local_e0
                      );
          }
          std::__cxx11::string::~string((string *)&local_128);
          goto LAB_0015affe;
        }
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::Reg,void>
                  ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_128,
                   (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&local_e0);
        detail::ValueNumberTable::set
                  ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_e0,
                   (shared_ptr<mocker::ir::Addr> *)&local_128);
      }
      else {
LAB_0015afc7:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
LAB_0015afd1:
        std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mocker::ir::Reg,void>
                  ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_128,
                   (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&local_e0);
        detail::ValueNumberTable::set
                  ((ValueNumberTable *)valueNumber,(shared_ptr<mocker::ir::Reg> *)&local_e0,
                   (shared_ptr<mocker::ir::Addr> *)&local_128);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
    }
LAB_0015affe:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_e0._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    ~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             *)&local_108);
    peVar10 = (element_type *)(local_e8->super_Addr)._vptr_Addr;
  } while( true );
}

Assistant:

void GlobalValueNumbering::doValueNumbering(
    std::size_t bbLabel, detail::ValueNumberTable valueNumber,
    detail::InstHash instHash, ExprRegMap exprReg) {
  auto &bb = func.getMutableBasicBlock(bbLabel);

  auto iter = bb.getMutableInsts().begin();
  for (;; ++iter) {
    auto &inst = *iter;
    if (ir::dyc<ir::Deleted>(inst))
      continue;
    const auto phi = ir::dyc<ir::Phi>(inst);
    if (!phi)
      break;

    if (!canProcessPhi(phi, valueNumber)) {
      valueNumber.set(phi->getDest(), phi->getDest());
      continue;
    }

    if (auto val = uniquePhiValues(phi)) { // phi is meaningless
      valueNumber.set(phi->getDest(), val);
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }

    auto key = instHash(inst);
    if (isIn(exprReg, key)) { // reusable
      valueNumber.set(phi->getDest(), exprReg.at(key));
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }

    valueNumber.set(phi->getDest(), phi->getDest());
    exprReg[key] = phi->getDest();
  }

  for (auto End = bb.getMutableInsts().end(); iter != End; ++iter) {
    auto &inst = *iter;
    auto newOperands = ir::getOperandsUsed(inst);
    for (auto &operand : newOperands)
      operand = valueNumber.get(operand);
    inst = ir::copyWithReplacedOperands(inst, newOperands);

    auto dest = ir::getDest(inst);
    if (!dest)
      continue;
    if (ir::dyc<ir::Load>(inst) || ir::dyc<ir::Alloca>(inst) ||
        ir::dyc<ir::Malloc>(inst) || ir::dyc<ir::Call>(inst)) {
      valueNumber.set(dest, dest);
      continue;
    }
    // Do not value number relation instructions.
    // [cf. instruction_selection.cpp, genRelation]
    if (ir::dyc<ir::RelationInst>(inst)) {
      valueNumber.set(dest, dest);
      continue;
    }

    auto key = instHash(inst);
    if (isIn(exprReg, key)) {
      auto res = exprReg.at(key);
      valueNumber.set(dest, res);
      inst = std::make_shared<ir::Deleted>();
      ++cnt;
      continue;
    }
    valueNumber.set(dest, dest);
    exprReg[key] = dest;
  }

  auto adjustPhi = [bbLabel,
                    &valueNumber](const std::shared_ptr<ir::Phi> &phi) {
    std::vector<ir::Phi::Option> newOptions;
    for (auto &option : phi->getOptions()) {
      if (option.second->getID() != bbLabel) {
        newOptions.emplace_back(option);
        continue;
      }
      newOptions.emplace_back(
          std::make_pair(valueNumber.get(option.first), option.second));
    }
    return std::make_shared<ir::Phi>(phi->getDest(), std::move(newOptions));
  };
  for (auto sucLabel : bb.getSuccessors()) {
    auto &sucBB = func.getMutableBasicBlock(sucLabel);
    for (auto &inst : sucBB.getMutableInsts()) {
      if (ir::dyc<ir::Deleted>(inst))
        continue;
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      inst = adjustPhi(phi);
    }
  }

  for (auto c : dominatorTree.getChildren(bbLabel))
    doValueNumbering(c, valueNumber, instHash, exprReg);
}